

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Resub(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint fUseXor;
  int iVar4;
  uint iChoice;
  char *pcVar5;
  int in_stack_ffffffffffffffb8;
  uint local_44;
  uint nSupp;
  uint local_3c;
  
  local_44 = 0;
  Extra_UtilGetoptReset();
  nSupp = 0;
  local_3c = 0;
  iChoice = 0;
  fUseXor = 0;
LAB_0027d552:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NSDvwh"), iVar4 = globalUtilOptind, iVar1 == 0x77) {
      fUseXor = fUseXor ^ 1;
    }
    if (iVar1 < 0x4e) {
      if (iVar1 == -1) {
        if (globalUtilOptind + 1 == argc) {
          pNew = Gia_ManResub1(argv[globalUtilOptind],local_44,nSupp,local_3c,iChoice,fUseXor,
                               in_stack_ffffffffffffffb8,nSupp);
        }
        else {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            pcVar3 = "Abc_CommandAbc9Resub(): There is no AIG.\n";
            iVar4 = -1;
            goto LAB_0027d6f4;
          }
          pNew = Gia_ManResub2(pAbc->pGia,local_44,nSupp,local_3c,iChoice,fUseXor,
                               in_stack_ffffffffffffffb8,nSupp);
        }
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      if (iVar1 != 0x44) goto LAB_0027d636;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-D\" should be followed by a floating point number.\n";
        goto LAB_0027d7a6;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_3c = uVar2;
    }
    else {
      if (iVar1 == 0x76) {
        iChoice = iChoice ^ 1;
        goto LAB_0027d552;
      }
      if (iVar1 == 0x53) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-S\" should be followed by a floating point number.\n";
          goto LAB_0027d7a6;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        nSupp = uVar2;
      }
      else {
        if (iVar1 != 0x4e) goto LAB_0027d636;
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-N\" should be followed by a floating point number.\n";
LAB_0027d7a6:
          Abc_Print(1,pcVar3);
          return 0;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_44 = uVar2;
      }
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_0027d636:
      Abc_Print(-2,"usage: &resub [-NSD num] [-vwh]\n");
      Abc_Print(-2,"\t           performs AIG resubstitution\n");
      Abc_Print(-2,"\t-N num   : the limit on added nodes (num >= 0) [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-S num   : the limit on support size (num > 0) [default = %d]\n",(ulong)nSupp)
      ;
      Abc_Print(-2,"\t-D num   : the limit on divisor count (num > 0) [default = %d]\n",
                (ulong)local_3c);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (iChoice == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles printing verbose information [default = %s]\n",pcVar3);
      if (fUseXor == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles printing additional information [default = %s]\n",pcVar5);
      pcVar3 = "\t-h       : print the command usage\n";
      iVar4 = -2;
LAB_0027d6f4:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Resub( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int fVerbose, int fVeryVerbose );
    extern Gia_Man_t * Gia_ManResub2( Gia_Man_t * pGia, int nNodes, int nSupp, int nDivs, int fVerbose, int fVeryVerbose );
    Gia_Man_t * pTemp;
    int nNodes       =  0;
    int nSupp        =  0;
    int nDivs        =  0;
    int c, fVerbose  =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSDvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-N\" should be followed by a floating point number.\n" );
                return 0;
            }
            nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodes < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                return 0;
            }
            nSupp = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSupp < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                return 0;
            }
            nDivs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDivs < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        pTemp = Gia_ManResub1( argv[globalUtilOptind], nNodes, nSupp, nDivs, fVerbose, fVeryVerbose );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resub(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManResub2( pAbc->pGia, nNodes, nSupp, nDivs, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &resub [-NSD num] [-vwh]\n" );
    Abc_Print( -2, "\t           performs AIG resubstitution\n" );
    Abc_Print( -2, "\t-N num   : the limit on added nodes (num >= 0) [default = %d]\n",     nNodes );
    Abc_Print( -2, "\t-S num   : the limit on support size (num > 0) [default = %d]\n",     nSupp );
    Abc_Print( -2, "\t-D num   : the limit on divisor count (num > 0) [default = %d]\n",    nDivs );
    Abc_Print( -2, "\t-v       : toggles printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}